

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayLen(InternalAnalyzer *this,ArrayLen *curr)

{
  bool bVar1;
  ArrayLen *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    bVar1 = wasm::Type::isNullable(&curr->ref->type);
    if (bVar1) {
      this->parent->implicitTrap = true;
    }
  }
  return;
}

Assistant:

void visitArrayLen(ArrayLen* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      // traps when the arg is null
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
    }